

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O0

void llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode
               (FileInfo *value,BinaryDecoder *coder)

{
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  BinaryDecoder *coder_local;
  FileInfo *value_local;
  
  __fd = (int)value;
  BinaryDecoder::read(coder,__fd,in_RDX,in_RCX);
  BinaryDecoder::read(coder,__fd + 8,__buf,in_RCX);
  BinaryDecoder::read(coder,__fd + 0x10,__buf_00,in_RCX);
  BinaryDecoder::read(coder,__fd + 0x18,__buf_01,in_RCX);
  BinaryDecoder::read<llbuild::basic::FileTimestamp>(coder,&value->modTime);
  BinaryDecoder::read<llbuild::basic::FileChecksum>(coder,&value->checksum);
  return;
}

Assistant:

static inline void decode(FileInfo& value, BinaryDecoder& coder) {
    coder.read(value.device);
    coder.read(value.inode);
    coder.read(value.mode);
    coder.read(value.size);
    coder.read(value.modTime);
    coder.read(value.checksum);
  }